

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Dump.c
# Opt level: O2

void Llb_ManDumpReached(DdManager *ddG,DdNode *bReached,char *pModel,char *pFileName)

{
  uint nDigits;
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  char *pcVar3;
  Vec_Ptr_t *p_00;
  FILE *__stream;
  void *pvVar4;
  uint uVar5;
  DdNode *bReached_local;
  
  bReached_local = bReached;
  Cudd_ReduceHeap(ddG,CUDD_REORDER_SYMM_SIFT,1);
  nDigits = Cudd_ReadSize(ddG);
  if (1 < nDigits) {
    uVar5 = nDigits - 1;
    nDigits = 0;
    for (; uVar5 != 0; uVar5 = uVar5 / 10) {
      nDigits = nDigits + 1;
    }
  }
  iVar1 = Cudd_ReadSize(ddG);
  p = Vec_PtrAlloc(iVar1);
  iVar1 = 0;
  while( true ) {
    iVar2 = Cudd_ReadSize(ddG);
    if (iVar2 <= iVar1) break;
    Llb_ManGetDummyName("ff",iVar1,nDigits);
    pcVar3 = Extra_UtilStrsav(Llb_ManGetDummyName::Buffer);
    Vec_PtrPush(p,pcVar3);
    iVar1 = iVar1 + 1;
  }
  p_00 = Vec_PtrAlloc(1);
  pcVar3 = Extra_UtilStrsav("Reached");
  Vec_PtrPush(p_00,pcVar3);
  __stream = fopen(pFileName,"wb");
  Cudd_DumpBlif(ddG,1,&bReached_local,(char **)p->pArray,(char **)p_00->pArray,pModel,
                (FILE *)__stream,0);
  fclose(__stream);
  iVar1 = p->nSize;
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
    iVar2 = 0;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    pvVar4 = Vec_PtrEntry(p,iVar2);
    free(pvVar4);
  }
  iVar1 = p_00->nSize;
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    pvVar4 = Vec_PtrEntry(p_00,iVar2);
    free(pvVar4);
  }
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Llb_ManDumpReached( DdManager * ddG, DdNode * bReached, char * pModel, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn, * vNamesOut;
    char * pName;
    int i, nDigits;
    // reorder the BDD
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // create input names
    nDigits = Abc_Base10Log( Cudd_ReadSize(ddG) );
    vNamesIn = Vec_PtrAlloc( Cudd_ReadSize(ddG) );
    for ( i = 0; i < Cudd_ReadSize(ddG); i++ )
    {
        pName = Llb_ManGetDummyName( "ff", i, nDigits );
        Vec_PtrPush( vNamesIn, Extra_UtilStrsav(pName) );
    }
    // create output names
    vNamesOut = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vNamesOut, Extra_UtilStrsav("Reached") );

    // write the file
    pFile = fopen( pFileName, "wb" );
    Cudd_DumpBlif( ddG, 1, &bReached, (char **)Vec_PtrArray(vNamesIn), (char **)Vec_PtrArray(vNamesOut), pModel, pFile, 0 );
    fclose( pFile );

    // cleanup
    Vec_PtrForEachEntry( char *, vNamesIn, pName, i )
        ABC_FREE( pName );
    Vec_PtrForEachEntry( char *, vNamesOut, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( vNamesIn );
    Vec_PtrFree( vNamesOut );
}